

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O2

json helics::fileops::loadJsonStr_abi_cxx11_(string_view jsonString)

{
  char *in_RDX;
  json_value extraout_RDX;
  json jVar1;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<char_const*>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)jsonString._M_len,in_RDX,jsonString._M_str + (long)in_RDX,
             (parser_callback_t *)&local_38,true,true);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  jVar1.m_data.m_value.object = extraout_RDX.object;
  jVar1.m_data._0_8_ =
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        *)jsonString._M_len;
  return (json)jVar1.m_data;
}

Assistant:

nlohmann::json loadJsonStr(std::string_view jsonString)
{
    try {
        return nlohmann::json::parse(jsonString.begin(), jsonString.end(), nullptr, true, true);
    }
    catch (const nlohmann::json::parse_error& errs) {
        throw(std::invalid_argument(errs.what()));
    }
}